

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::dmax(Forth *this)

{
  uint Value;
  uint Value_00;
  uint uVar1;
  uint uVar2;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,4,"DMAX");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00,1);
  Value_00 = ForthStack<unsigned_int>::getTop(this_00);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,2);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (CONCAT44(uVar2,uVar1) < CONCAT44(Value_00,Value)) {
    ForthStack<unsigned_int>::setTop(this_00,1,Value);
    ForthStack<unsigned_int>::setTop(this_00,0,Value_00);
    return;
  }
  return;
}

Assistant:

void dmax(){
			REQUIRE_DSTACK_DEPTH(4, "DMAX");
			DCell d2(dStack.getTop(1), dStack.getTop());
			DCell d1(dStack.getTop(3), dStack.getTop(2));
			dStack.pop();dStack.pop();
			if(d2.data_.SDcells>d1.data_.SDcells){
			 dStack.setTop(1, d2.data_.Cells.lo);
			 dStack.setTop(0, d2.data_.Cells.hi);
			}
		}